

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Accuracy::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  int iVar1;
  CoordType CVar2;
  CoordType CVar3;
  Texture2D *pTVar4;
  TestLog *log;
  RenderContext *context;
  TestContext *this_00;
  long lVar5;
  int height;
  int iVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  int y;
  int iVar10;
  int x;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NotSupportedError *this_01;
  int iVar13;
  uint cellNdx;
  int gridX;
  long lVar14;
  int gridY;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int local_254;
  int local_24c;
  RandomViewport viewport;
  Vec2 p3;
  Vec2 p2;
  Vec2 p1;
  vector<float,_std::allocator<float>_> texCoord;
  Mat2 transform;
  Vec4 *local_1c0;
  Mat2 shearMatrix;
  Vec2 p0;
  Mat2 rotMatrix;
  Vector<float,_2> local_140;
  Surface idealFrame;
  Surface renderedFrame;
  undefined1 local_104 [76];
  float afStack_b8 [2];
  LodMode local_84;
  TextureFormatInfo fmtInfo;
  long lVar12;
  
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar7);
  pTVar4 = this->m_texture;
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&pTVar4->m_refTexture);
  iVar7 = (pTVar4->m_refTexture).m_width;
  iVar1 = (pTVar4->m_refTexture).m_height;
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar9 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar8),iVar7 * 4,iVar1 * 4,dVar9);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_104,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  CVar2 = this->m_coordType;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&idealFrame,viewport.width,viewport.height);
  lVar5 = (long)viewport.width;
  iVar8 = viewport.height / 4;
  if ((viewport.width < iVar7 * 4) || (viewport.height < iVar1 * 4)) {
    this_01 = (NotSupportedError *)
              __cxa_allocate_exception(0x38,viewport.width,(long)viewport.height % 4 & 0xffffffff);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
               ,0x11a);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)&rotMatrix,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  local_104._68_4_ = rotMatrix.m_data.m_data[0].m_data[0];
  local_104._72_4_ = rotMatrix.m_data.m_data[0].m_data[1];
  afStack_b8[0] = rotMatrix.m_data.m_data[1].m_data[0];
  afStack_b8[1] = rotMatrix.m_data.m_data[1].m_data[1];
  local_104._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_104._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_104._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_104._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_104._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_104._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_104._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_104._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_104._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_104._8_4_ = (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2
  ;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar12 + 8))(0x84c0);
  (**(code **)(lVar12 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2800,0x2600);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
                  ,0x130);
  if (iterate()::s_projections == '\0') {
    iVar11 = __cxa_guard_acquire(&iterate()::s_projections);
    if (iVar11 != 0) {
      iterate::s_projections[0].m_data[0] = _DAT_017fad50;
      iterate::s_projections[0].m_data[1] = _UNK_017fad54;
      iterate::s_projections[0].m_data[2] = _UNK_017fad58;
      iterate::s_projections[0].m_data[3] = _UNK_017fad5c;
      iterate::s_projections[1].m_data[0] = _DAT_017fad60;
      iterate::s_projections[1].m_data[1] = _UNK_017fad64;
      iterate::s_projections[1].m_data[2] = _UNK_017fad68;
      iterate::s_projections[1].m_data[3] = _UNK_017fad6c;
      iterate::s_projections[2].m_data[0] = _DAT_017fad70;
      iterate::s_projections[2].m_data[1] = _UNK_017fad74;
      iterate::s_projections[2].m_data[2] = _UNK_017fad78;
      iterate::s_projections[2].m_data[3] = _UNK_017fad7c;
      iterate::s_projections[3].m_data[0] = _DAT_017fad80;
      iterate::s_projections[3].m_data[1] = _UNK_017fad84;
      iterate::s_projections[3].m_data[2] = _UNK_017fad88;
      iterate::s_projections[3].m_data[3] = _UNK_017fad8c;
      __cxa_guard_release(&iterate()::s_projections);
    }
  }
  local_254 = 0xf;
  iVar6 = -4;
  iVar11 = 0;
  lVar15 = 0;
  iVar16 = (int)(lVar5 / 4);
  do {
    if (lVar15 == 4) {
      context = this->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&rotMatrix,&renderedFrame);
      glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&rotMatrix);
      shearMatrix.m_data.m_data[0].m_data[0] =
           (float)glu::TextureTestUtil::measureAccuracy
                            (log,&idealFrame,&renderedFrame,(iVar7 / 0x10) * (iVar1 / 0x10),
                             iVar1 * iVar7);
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      de::toString<int>((string *)&rotMatrix,(int *)&shearMatrix);
      tcu::TestContext::setTestResult
                (this_00,QP_TEST_RESULT_PASS,(char *)rotMatrix.m_data.m_data[0].m_data);
      std::__cxx11::string::~string((string *)&rotMatrix);
      tcu::Surface::~Surface(&idealFrame);
      tcu::Surface::~Surface(&renderedFrame);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
      return STOP;
    }
    y = iVar8 * (int)lVar15;
    x = 0;
    iVar13 = 0;
    local_1c0 = iterate::s_projections;
    local_24c = local_254;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      uVar17 = (ulong)(uint)(viewport.width + iVar13);
      if (lVar14 != 3) {
        uVar17 = lVar5 / 4 & 0xffffffff;
      }
      height = viewport.height - y;
      if (lVar15 != 3) {
        height = iVar8;
      }
      iVar10 = (int)lVar14;
      cellNdx = iVar11 + iVar10;
      CVar3 = this->m_coordType;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_00e2b05f:
        getBasicTexCoord2D(&texCoord,iVar11 + iVar10);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getBasicTexCoord2D(&texCoord,cellNdx);
        tcu::rotationMatrix((tcu *)&rotMatrix,(float)(int)cellNdx * 0.0625 * 6.2831855);
        transform.m_data.m_data[0].m_data[0] = (float)local_24c * 0.0625;
        if (7 < (uint)(iVar6 + iVar10)) {
          transform.m_data.m_data[0].m_data[0] = 0.0;
        }
        transform.m_data.m_data[0].m_data[1] = 0.0;
        tcu::shearMatrix((tcu *)&shearMatrix,(Vector<float,_2> *)&transform);
        tcu::operator*((tcu *)&transform,&rotMatrix,&shearMatrix);
        p1.m_data = *(float (*) [2])
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
        tcu::operator*((tcu *)&p0,&transform,&p1);
        p2.m_data = *(float (*) [2])
                     (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + 2);
        tcu::operator*((tcu *)&p1,&transform,&p2);
        p3.m_data = *(float (*) [2])
                     (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + 4);
        tcu::operator*((tcu *)&p2,&transform,&p3);
        local_140.m_data =
             *(float (*) [2])
              (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + 6);
        tcu::operator*((tcu *)&p3,&transform,&local_140);
        *texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start = p0.m_data[0];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = p0.m_data[1];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = p1.m_data[0];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[3] = p1.m_data[1];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[4] = p2.m_data[0];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[5] = p2.m_data[1];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[6] = p3.m_data[0];
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[7] = p3.m_data[1];
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_00e2b05f;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_104._12_8_ = *(undefined8 *)local_1c0->m_data;
        local_104._20_8_ = *(undefined8 *)(local_1c0->m_data + 2);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_104._28_4_ = iterate::s_bias[cellNdx & 7];
      }
      (**(code **)(lVar12 + 0x1a00))(viewport.x + x,viewport.y + y,uVar17,height);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_104);
      iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&rotMatrix,&idealFrame,
                 (PixelFormat *)(CONCAT44(extraout_var_01,iVar10) + 8),x,y,(int)uVar17,height);
      local_84 = LODMODE_EXACT;
      shearMatrix.m_data.m_data[0].m_data[0] =
           (float)(this->m_texture->m_refTexture).m_view.m_numLevels;
      shearMatrix.m_data.m_data[1].m_data =
           (float  [2])(this->m_texture->m_refTexture).m_view.m_levels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&rotMatrix,(Texture2DView *)&shearMatrix,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
      local_24c = local_24c + -1;
      local_1c0 = local_1c0 + 1;
      iVar13 = iVar13 - iVar16;
      x = x + iVar16;
    }
    lVar15 = lVar15 + 1;
    iVar11 = iVar11 + 4;
    local_254 = local_254 + -4;
    iVar6 = iVar6 + 4;
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	// Constants.
	const deUint32				magFilter			= GL_NEAREST;

	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&	texFmt				= refTexture.getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	int							texWidth			= refTexture.getWidth();
	int							texHeight			= refTexture.getHeight();
	int							defViewportWidth	= texWidth*4;
	int							defViewportHeight	= texHeight*4;

	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;
	bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface				idealFrame			(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);

			// Render reference(s).
			{
				tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleParams.lodMode = LODMODE_EXACT;
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], sampleParams);
			}
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}